

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HApp.cpp
# Opt level: O2

int solvePlainWithPresolve(char *filename)

{
  int iVar1;
  double time1;
  HModel model;
  double dStack_11a8;
  HModel local_11a0 [4496];
  
  HModel::HModel(local_11a0);
  iVar1 = HModel::load_fromMPS((char *)local_11a0);
  if (iVar1 == 0) {
    presolve(local_11a0,&dStack_11a8);
  }
  HModel::~HModel(local_11a0);
  return iVar1;
}

Assistant:

int solvePlainWithPresolve(const char *filename) {
	HModel model;
	int RtCd = model.load_fromMPS(filename);
	    if (RtCd) return RtCd;
	double time1;

	double obj1 = presolve(model, time1);
	(void)obj1;

	//to test singularity of basis matrix after postsolve
/*
	HModel model2;

	model2.load_fromMPS(filename);
	model2.scaleModel();

	HDual solver2;
	solver2.solve(&model2);
	model2.util_reportSolverOutcome("Presolve 1");
	double obj2 = model2.util_getObjectiveValue();

	//testing
	int * x = model2.getNonbasicFlag();
	int len = model2.getNumTot();
	vector<int> v(len);
	for (int i=0;i<len;i++)
		v[i] = (x[i]);

	int * xx = model2.getBaseIndex();
	len = model2.getNumRow();
	vector<int> vv(len);
	for (int i=0;i<len;i++)
		vv[i] = (xx[i]);

	HModel mod;
	mod.load_fromMPS(filename);
	double time1;
	HPresolve * pre = new HPresolve();
	mod.copy_fromHModelToHPresolve(pre);
	pre->presolve();
	mod.load_fromPresolve(pre);

	HDual solver;
	mod.scaleModel();
    solver.solve(&mod);
    mod.timer.reset();

    pre->setProblemStatus(mod.getPrStatus());
    mod.util_getPrimalDualValues(pre->colValue, pre->colDual, pre->rowValue, pre->rowDual);
    mod.util_getBasicIndexNonbasicFlag(pre->basicIndex, pre->nonbasicFlag);
    pre->setNBFfullproblem(v, vv);  //testing
    pre->postsolve();
    mod.shiftObjectiveValue(pre->objShift);

    mod.util_reportSolverOutcome("Postsolve 1");

    time1 = mod.totalTime ;
	double obj1 = mod.util_getObjectiveValue();
	delete pre;


	if (abs(obj1-obj2)>0.000001)
		cout<<"OBJECTIVE FAIL: diff = "<<obj1-obj2<<endl;
	*/

/*	// to compare data presolve receives and returns after postsolve
	HModel model;
	model.load_fromMPS(filename);

	HinOut test("","");
	test.getData(model);


	double time1;
	double obj1 = presolve(model, time1);

	test.readDataPostsolve(model);
	test.compareData(2);
*/
	return 0;
}